

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O3

shared_ptr<chrono::ChMaterialSurface> __thiscall
chrono::curiosity::DefaultContactMaterial(curiosity *this,ChContactMethod contact_method)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<chrono::ChMaterialSurface> sVar1;
  undefined1 local_29;
  ChMaterialSurfaceNSC *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  if (contact_method == SMC) {
    local_28 = (ChMaterialSurfaceNSC *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChMaterialSurfaceSMC,std::allocator<chrono::ChMaterialSurfaceSMC>>
              (a_Stack_20,(ChMaterialSurfaceSMC **)&local_28,
               (allocator<chrono::ChMaterialSurfaceSMC> *)&local_29);
    chrono::ChMaterialSurface::SetFriction(0.4);
    *(undefined8 *)(local_28 + 0x18) = 0x4b98968000000000;
    *(undefined4 *)(local_28 + 0x20) = 0x3e99999a;
    *(undefined8 *)(local_28 + 0x30) = 0x4843500048435000;
    *(undefined8 *)(local_28 + 0x38) = 0x41a0000042200000;
    in_RDX._M_pi = extraout_RDX_00;
  }
  else if (contact_method == NSC) {
    local_28 = (ChMaterialSurfaceNSC *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChMaterialSurfaceNSC,std::allocator<chrono::ChMaterialSurfaceNSC>>
              (a_Stack_20,&local_28,(allocator<chrono::ChMaterialSurfaceNSC> *)&local_29);
    chrono::ChMaterialSurface::SetFriction(0.4);
    *(undefined4 *)(local_28 + 0x18) = 0;
    in_RDX._M_pi = extraout_RDX;
  }
  else {
    local_28 = (ChMaterialSurfaceNSC *)0x0;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  *(ChMaterialSurfaceNSC **)this = local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = a_Stack_20[0]._M_pi;
  sVar1.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RDX._M_pi;
  sVar1.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChMaterialSurface>)
         sVar1.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChMaterialSurface> DefaultContactMaterial(ChContactMethod contact_method) {
    float mu = 0.4f;   // coefficient of friction
    float cr = 0.0f;   // coefficient of restitution
    float Y = 2e7f;    // Young's modulus
    float nu = 0.3f;   // Poisson ratio
    float kn = 2e5f;   // normal stiffness
    float gn = 40.0f;  // normal viscous damping
    float kt = 2e5f;   // tangential stiffness
    float gt = 20.0f;  // tangential viscous damping

    switch (contact_method) {
        case ChContactMethod::NSC: {
            auto matNSC = chrono_types::make_shared<ChMaterialSurfaceNSC>();
            matNSC->SetFriction(mu);
            matNSC->SetRestitution(cr);
            return matNSC;
        }
        case ChContactMethod::SMC: {
            auto matSMC = chrono_types::make_shared<ChMaterialSurfaceSMC>();
            matSMC->SetFriction(mu);
            matSMC->SetRestitution(cr);
            matSMC->SetYoungModulus(Y);
            matSMC->SetPoissonRatio(nu);
            matSMC->SetKn(kn);
            matSMC->SetGn(gn);
            matSMC->SetKt(kt);
            matSMC->SetGt(gt);
            return matSMC;
        }
        default:
            return std::shared_ptr<ChMaterialSurface>();
    }
}